

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_tesselation_evaluation_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  attributeDefinition *paVar5;
  ostream *poVar6;
  size_t sVar7;
  long *plVar8;
  GLuint n_components;
  char *attribute_name_prefix;
  char *pcVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  attributeDefinition *paVar13;
  int iVar14;
  bool *local_230;
  string sampling_code;
  char *local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  attribute_name_prefix = "vs_out_";
  if ((uVar4 & 0x300) == 0) {
    attribute_name_prefix = "tcs_out_";
  }
  sampling_function_00 = *sampling_function;
  n_components = 0;
  switch(sampling_function_00) {
  case Texture:
    paVar13 = getAttributes::texture_attributes;
    goto LAB_00d6a570;
  case TextureLod:
    paVar13 = getAttributes::textureLod_attributes;
    iVar14 = 2;
    break;
  case TextureGrad:
    paVar13 = getAttributes::textureGrad_attributes;
    iVar14 = 3;
    break;
  case TextureGather:
    paVar13 = getAttributes::textureGather_attributes;
LAB_00d6a570:
    iVar14 = 1;
    break;
  default:
    bVar12 = false;
    iVar14 = 0;
    paVar13 = (attributeDefinition *)0x0;
    goto LAB_00d6a58c;
  }
  bVar12 = true;
LAB_00d6a58c:
  sVar1 = *sampler_type;
  paVar5 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar5 = (attributeDefinition *)0x0;
  }
  local_1f8 = (GLchar *)0x0;
  local_230 = (bool *)0x0;
  pcVar9 = (char *)0x0;
  switch(sVar1) {
  case Float:
    pcVar9 = "samplerCubeArray ";
    n_components = 4;
    local_230 = fixed_sample_locations_values + 1;
    local_1f8 = "vec4 ";
    break;
  case Int:
    pcVar9 = "isamplerCubeArray ";
    n_components = 4;
    local_230 = (bool *)0x1b33191;
    local_1f8 = "ivec4 ";
    break;
  case UInt:
    pcVar9 = "usamplerCubeArray ";
    n_components = 4;
    local_230 = (bool *)0x1b33191;
    local_1f8 = "uvec4 ";
    break;
  case Depth:
    local_1f8 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,"float ",1,
               attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",&sampling_code);
    local_230 = fixed_sample_locations_values + 1;
    pcVar9 = "samplerCubeArrayShadow ";
    goto LAB_00d6a6fd;
  case Stencil:
    pcVar9 = "usamplerCubeArray ";
    n_components = 1;
    local_230 = (bool *)0x1b33191;
    local_1f8 = "uint ";
  }
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,local_1f8,
             n_components,attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",
             &sampling_code);
LAB_00d6a6fd:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${TESSELLATION_SHADER_REQUIRE}\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"/* Sampling tesselation evaluation shader */",0x2c);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(isolines, point_mode) in;\n\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar10 = (ulong)((uVar4 & 0x300) == 0) + 7;
  if (bVar12) {
    lVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar9 = *(char **)((long)&paVar13->type + lVar11);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,attribute_name_prefix,lVar10);
      pcVar9 = *(char **)((long)&paVar13->name + lVar11);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar11 = lVar11 + 0x18;
    } while ((ulong)(iVar14 + (uint)(iVar14 == 0)) * 0x18 != lVar11);
  }
  if (sVar1 == Depth) {
    bVar12 = true;
    lVar11 = 0;
    while (bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar9 = paVar5[lVar11].type;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,attribute_name_prefix,lVar10);
      pcVar9 = paVar5[lVar11].name;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      lVar11 = 1;
      bVar12 = false;
      std::ostream::flush();
    }
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (local_230 == (bool *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(local_230);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_230,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (local_1f8 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f8,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"fs_in_color",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main()\n{\n    gl_Position = gl_in[0].gl_Position;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)out_tesselation_evaluation_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode(
	const samplerType& sampler_type, const samplingFunction& sampling_function,
	std::string& out_tesselation_evaluation_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;
	const glw::GLchar*		   prev_stage_output = (glu::isContextTypeES(m_context.getRenderContext().getType())) ?
											   tesselation_control_shader_output :
											   vertex_shader_output;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble, extension : require */
	stream << shader_code_preamble << tesselation_shader_extension << shader_precision << std::endl
		   << "/* Sampling tesselation evaluation shader */" << std::endl;

	/* layout(point_mode) in; */
	stream << tesselation_evaluation_shader_layout;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in type attribute[]*/
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << prev_stage_output
			   << routine_attribute_definitions[i].name << "[];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << prev_stage_output
			   << type_attribute_definitions[i].name << "[];" << std::endl;
	}

	stream << std::endl;

	/* out vec4 tes_in_color */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << tesselation_evaluation_shader_sampling_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_tesselation_evaluation_shader_code = stream.str();
}